

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gelu_x86_fma.cpp
# Opt level: O0

int __thiscall
ncnn::GELU_x86_fma::forward_inplace(GELU_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [24];
  long *in_RSI;
  long in_RDI;
  float fVar31;
  float fVar33;
  float fVar34;
  float fVar36;
  float fVar37;
  undefined8 uVar35;
  float fVar38;
  float fVar39;
  float fVar40;
  undefined1 auVar32 [32];
  v4sf afVar41;
  __m128 _blob_1;
  __m128 _cube_1;
  __m128 _pLoad_1;
  __m128 _fast2c128;
  __m128 _fast1c128;
  __m128 _one128;
  __m128 _half128;
  __m256 _blob;
  __m256 _cube;
  __m256 _pLoad;
  __m256 _fast2c256;
  __m256 _fast1c256;
  __m256 _one256;
  __m256 _half256;
  int i;
  float *ptr;
  int q;
  int size;
  int channels;
  int elempack;
  int d;
  int h;
  int w;
  Mat *m;
  __m256 dst;
  __m256 q_1;
  __m256 p;
  __m256 value_squared;
  __m256 value;
  undefined8 local_e30;
  undefined8 uStackY_e28;
  undefined8 local_dc0;
  undefined8 uStackY_db8;
  undefined8 uStackY_db0;
  undefined8 uStackY_da8;
  Option *in_stack_fffffffffffff2b8;
  Mat *in_stack_fffffffffffff2c0;
  GELU *in_stack_fffffffffffff2c8;
  int local_cd0;
  undefined8 local_cc0;
  undefined8 local_cb8;
  undefined8 local_cb0;
  undefined4 local_ca8;
  long local_ca0;
  undefined4 local_c98;
  undefined4 local_c94;
  undefined4 local_c90;
  undefined4 local_c8c;
  undefined4 local_c88;
  undefined8 local_c80;
  float *local_c78;
  int local_c6c;
  int local_c68;
  int local_c64;
  int local_c60;
  int local_c5c;
  int local_c58;
  int local_c54;
  long *local_c48;
  int local_c34;
  undefined1 local_c2d;
  int local_c2c;
  undefined8 *local_c20;
  undefined8 *local_c18;
  undefined8 *local_c08;
  undefined4 local_bf8;
  undefined4 local_bf4;
  undefined4 local_bf0;
  undefined4 local_bec;
  float *local_be8;
  float local_be0;
  float fStack_bdc;
  float fStack_bd8;
  float fStack_bd4;
  float fStack_bd0;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  undefined8 local_ac0;
  undefined8 uStack_ab8;
  undefined8 uStack_ab0;
  undefined8 uStack_aa8;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined1 local_9e0 [32];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [8];
  undefined8 uStack_998;
  undefined8 uStack_990;
  ulong uStack_988;
  float local_980;
  float fStack_97c;
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  undefined4 uStack_964;
  undefined1 local_960 [32];
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  float *local_878;
  undefined4 local_870;
  undefined4 uStack_86c;
  undefined4 uStack_868;
  undefined4 uStack_864;
  undefined4 local_854;
  undefined4 local_850;
  undefined4 uStack_84c;
  undefined4 uStack_848;
  undefined4 uStack_844;
  undefined4 local_834;
  undefined4 local_830;
  undefined4 uStack_82c;
  undefined4 uStack_828;
  undefined4 uStack_824;
  undefined4 local_814;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined4 local_7fc;
  float *local_7f8;
  float local_7f0;
  float fStack_7ec;
  float fStack_7e8;
  float fStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 local_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  float *local_6d8;
  long local_6d0;
  undefined4 local_6c4;
  long local_6c0;
  float *local_6b8;
  undefined4 local_6ac;
  int local_6a8;
  int local_6a4;
  undefined8 *local_6a0;
  undefined4 local_694;
  long local_690;
  undefined8 *local_670;
  undefined1 local_640 [16];
  undefined1 auStack_630 [16];
  undefined4 local_620;
  undefined4 local_61c;
  undefined4 local_618;
  undefined4 local_614;
  undefined4 local_610;
  undefined4 local_60c;
  undefined4 local_608;
  undefined4 local_604;
  undefined1 local_600 [16];
  undefined1 auStack_5f0 [16];
  undefined4 local_5e0;
  undefined4 local_5dc;
  undefined4 local_5d8;
  undefined4 local_5d4;
  undefined4 local_5d0;
  undefined4 local_5cc;
  undefined4 local_5c8;
  undefined4 local_5c4;
  undefined1 local_5c0 [16];
  undefined1 auStack_5b0 [16];
  undefined4 local_5a0;
  undefined4 local_59c;
  undefined4 local_598;
  undefined4 local_594;
  undefined4 local_590;
  undefined4 local_58c;
  undefined4 local_588;
  undefined4 local_584;
  undefined1 local_580 [32];
  undefined4 local_560;
  undefined4 local_55c;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined4 local_544;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  float *local_4b8;
  float *local_4b0;
  undefined1 *local_4a8;
  float *local_4a0;
  float *local_498;
  undefined1 *local_490;
  float *local_488;
  float *local_480;
  float *local_478;
  float *local_470;
  float *local_468;
  undefined1 *local_460;
  float *local_458;
  float *local_450;
  undefined1 *local_448;
  float *local_440;
  float *local_438;
  undefined1 *local_430;
  float *local_428;
  float *local_420;
  undefined1 *local_418;
  float *local_410;
  float *local_408;
  undefined1 *local_400;
  float *local_3f8;
  float *local_3f0;
  float *local_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 uStack_3b0;
  ulong uStack_3a8;
  float local_3a0 [2];
  float afStack_398 [2];
  float afStack_390 [2];
  float afStack_388 [2];
  float local_380 [2];
  float afStack_378 [2];
  float afStack_370 [2];
  float afStack_368 [2];
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  float local_340 [2];
  float afStack_338 [2];
  float afStack_330 [2];
  float afStack_328 [2];
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  float afStack_2d0 [2];
  float afStack_2c8 [2];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  float local_280 [2];
  float afStack_278 [2];
  float afStack_270 [2];
  float afStack_268 [2];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  float local_220 [2];
  float afStack_218 [2];
  float afStack_210 [2];
  float afStack_208 [2];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  float local_1c0 [2];
  float afStack_1b8 [2];
  float afStack_1b0 [2];
  float afStack_1a8 [2];
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  float local_160 [2];
  float afStack_158 [2];
  float afStack_150 [2];
  float afStack_148 [2];
  float local_140 [2];
  float afStack_138 [2];
  float afStack_130 [2];
  float afStack_128 [2];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  float local_100 [2];
  float afStack_f8 [2];
  float afStack_f0 [2];
  float afStack_e8 [2];
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  float local_a0 [2];
  float afStack_98 [2];
  float afStack_90 [2];
  float afStack_88 [2];
  undefined8 local_80;
  undefined8 uStack_78;
  undefined8 uStack_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 uStack_50;
  undefined8 uStack_48;
  
  if (*(int *)(in_RDI + 0xd0) == 0) {
    local_c34 = GELU::forward_inplace
                          (in_stack_fffffffffffff2c8,in_stack_fffffffffffff2c0,
                           in_stack_fffffffffffff2b8);
  }
  else {
    local_c54 = *(int *)((long)in_RSI + 0x2c);
    local_c58 = (int)in_RSI[6];
    local_c5c = *(int *)((long)in_RSI + 0x34);
    local_c60 = (int)in_RSI[3];
    local_c64 = (int)in_RSI[7];
    local_c68 = local_c54 * local_c58 * local_c5c * local_c60;
    local_c48 = in_RSI;
    for (local_c6c = 0; local_c6c < local_c64; local_c6c = local_c6c + 1) {
      local_c20 = &local_cc0;
      local_6a4 = *(int *)((long)local_c48 + 0x2c);
      local_6a8 = (int)local_c48[6];
      local_6ac = *(undefined4 *)((long)local_c48 + 0x34);
      local_6b8 = (float *)(*local_c48 + local_c48[8] * (long)local_c6c * local_c48[2]);
      local_6c0 = local_c48[2];
      local_6c4 = (undefined4)local_c48[3];
      local_6d0 = local_c48[4];
      local_6a0 = &local_cc0;
      local_690 = (long)local_6a4 * (long)local_6a8 * local_6c0;
      local_c18 = &local_cc0;
      local_c08 = &local_cc0;
      local_694 = 0x10;
      local_c2c = local_c6c;
      local_c2d = 1;
      local_cc0 = 0;
      local_cb0 = 0;
      local_ca8 = 0;
      local_c98 = 0;
      local_c94 = 0;
      local_c90 = 0;
      local_c8c = 0;
      local_c88 = 0;
      local_c80 = 0;
      local_cb8 = 0;
      local_cd0 = 0;
      local_bec = 0x3f000000;
      local_604 = 0x3f000000;
      local_608 = 0x3f000000;
      local_60c = 0x3f000000;
      local_610 = 0x3f000000;
      local_614 = 0x3f000000;
      local_618 = 0x3f000000;
      local_61c = 0x3f000000;
      local_620 = 0x3f000000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      local_640 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f000000),ZEXT416(0x3f000000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x20);
      auStack_630 = vinsertps_avx(auVar1,ZEXT416(0x3f000000),0x30);
      local_bf0 = 0x3f800000;
      local_5c4 = 0x3f800000;
      local_5c8 = 0x3f800000;
      local_5cc = 0x3f800000;
      local_5d0 = 0x3f800000;
      local_5d4 = 0x3f800000;
      local_5d8 = 0x3f800000;
      local_5dc = 0x3f800000;
      local_5e0 = 0x3f800000;
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      local_600 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x20);
      auStack_5f0 = vinsertps_avx(auVar1,ZEXT416(0x3f800000),0x30);
      local_bf4 = 0x3f4c4229;
      local_584 = 0x3f4c4229;
      local_588 = 0x3f4c4229;
      local_58c = 0x3f4c4229;
      local_590 = 0x3f4c4229;
      local_594 = 0x3f4c4229;
      local_598 = 0x3f4c4229;
      local_59c = 0x3f4c4229;
      local_5a0 = 0x3f4c4229;
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      local_5c0 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      auVar1 = vinsertps_avx(ZEXT416(0x3f4c4229),ZEXT416(0x3f4c4229),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x20);
      auStack_5b0 = vinsertps_avx(auVar1,ZEXT416(0x3f4c4229),0x30);
      local_bf8 = 0x3d372713;
      local_544 = 0x3d372713;
      local_548 = 0x3d372713;
      local_54c = 0x3d372713;
      local_550 = 0x3d372713;
      local_554 = 0x3d372713;
      local_558 = 0x3d372713;
      local_55c = 0x3d372713;
      local_560 = 0x3d372713;
      auVar1 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x20);
      auVar1 = vinsertps_avx(auVar1,ZEXT416(0x3d372713),0x30);
      auVar2 = vinsertps_avx(ZEXT416(0x3d372713),ZEXT416(0x3d372713),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3d372713),0x30);
      auVar32._16_16_ = auVar1;
      auVar32._0_16_ = auVar2;
      local_580._0_8_ = auVar2._0_8_;
      local_580._8_8_ = auVar2._8_8_;
      local_580._16_8_ = auVar1._0_8_;
      local_580._24_8_ = auVar1._8_8_;
      local_c78 = local_6b8;
      for (; local_cd0 + 7 < local_c68; local_cd0 = local_cd0 + 8) {
        local_be8 = local_c78;
        local_ba0 = *(undefined8 *)local_c78;
        uStack_b98 = *(undefined8 *)(local_c78 + 2);
        uStack_b90 = *(undefined8 *)(local_c78 + 4);
        uStack_b88 = *(undefined8 *)(local_c78 + 6);
        local_a80._0_4_ = (float)local_ba0;
        local_a80._4_4_ = (float)((ulong)local_ba0 >> 0x20);
        uStack_a78._0_4_ = (float)uStack_b98;
        uStack_a78._4_4_ = (float)((ulong)uStack_b98 >> 0x20);
        uStack_a70._0_4_ = (float)uStack_b90;
        uStack_a70._4_4_ = (float)((ulong)uStack_b90 >> 0x20);
        uStack_a68._0_4_ = (float)uStack_b88;
        uStack_a68._4_4_ = (float)((ulong)uStack_b88 >> 0x20);
        local_ae0 = CONCAT44(local_a80._4_4_ * local_a80._4_4_,(float)local_a80 * (float)local_a80);
        uStack_ad8 = CONCAT44(uStack_a78._4_4_ * uStack_a78._4_4_,
                              (float)uStack_a78 * (float)uStack_a78);
        uStack_ad0 = CONCAT44(uStack_a70._4_4_ * uStack_a70._4_4_,
                              (float)uStack_a70 * (float)uStack_a70);
        uStack_ac8 = CONCAT44(uStack_a68._4_4_,(float)uStack_a68 * (float)uStack_a68);
        fVar31 = (float)local_a80 * (float)local_a80 * (float)local_a80;
        fVar33 = local_a80._4_4_ * local_a80._4_4_ * local_a80._4_4_;
        fVar34 = (float)uStack_a78 * (float)uStack_a78 * (float)uStack_a78;
        fVar36 = uStack_a78._4_4_ * uStack_a78._4_4_ * uStack_a78._4_4_;
        fVar38 = (float)uStack_a70 * (float)uStack_a70 * (float)uStack_a70;
        fVar39 = uStack_a70._4_4_ * uStack_a70._4_4_ * uStack_a70._4_4_;
        fVar40 = (float)uStack_a68 * (float)uStack_a68 * (float)uStack_a68;
        local_b20 = CONCAT44(fVar33,fVar31);
        uStack_b18 = CONCAT44(fVar36,fVar34);
        uStack_b10 = CONCAT44(fVar39,fVar38);
        uStack_b08 = CONCAT44(uStack_a68._4_4_,fVar40);
        local_b00._0_4_ = auVar2._0_4_;
        local_b00._4_4_ = auVar2._4_4_;
        uStack_af8._0_4_ = auVar2._8_4_;
        uStack_af8._4_4_ = auVar2._12_4_;
        uStack_af0._0_4_ = auVar1._0_4_;
        uStack_af0._4_4_ = auVar1._4_4_;
        uStack_ae8._0_4_ = auVar1._8_4_;
        uStack_ae8._4_4_ = auVar1._12_4_;
        local_b00._0_4_ = (float)local_b00 * fVar31;
        local_b00._4_4_ = local_b00._4_4_ * fVar33;
        uStack_af8._0_4_ = (float)uStack_af8 * fVar34;
        uStack_af8._4_4_ = uStack_af8._4_4_ * fVar36;
        uStack_af0._0_4_ = (float)uStack_af0 * fVar38;
        uStack_af0._4_4_ = uStack_af0._4_4_ * fVar39;
        uStack_ae8._0_4_ = (float)uStack_ae8 * fVar40;
        local_dc0 = CONCAT44(local_b00._4_4_,(float)local_b00);
        uStackY_db8 = CONCAT44(uStack_af8._4_4_,(float)uStack_af8);
        uStackY_db0 = CONCAT44(uStack_af0._4_4_,(float)uStack_af0);
        uStackY_da8 = CONCAT44(uStack_ae8._4_4_,(float)uStack_ae8);
        local_a20 = local_dc0;
        uStack_a18 = uStackY_db8;
        uStack_a10 = uStackY_db0;
        uStack_a08 = uStackY_da8;
        local_b00._0_4_ = (float)local_a80 + (float)local_b00;
        local_b00._4_4_ = local_a80._4_4_ + local_b00._4_4_;
        uStack_af8._0_4_ = (float)uStack_a78 + (float)uStack_af8;
        uStack_af8._4_4_ = uStack_a78._4_4_ + uStack_af8._4_4_;
        uStack_af0._0_4_ = (float)uStack_a70 + (float)uStack_af0;
        uStack_af0._4_4_ = uStack_a70._4_4_ + uStack_af0._4_4_;
        uStack_ae8._0_4_ = (float)uStack_a68 + (float)uStack_ae8;
        local_dc0 = CONCAT44(local_b00._4_4_,(float)local_b00);
        uStackY_db8 = CONCAT44(uStack_af8._4_4_,(float)uStack_af8);
        uStackY_db0 = CONCAT44(uStack_af0._4_4_,(float)uStack_af0);
        uStackY_da8 = CONCAT44(uStack_a68._4_4_ + uStack_ae8._4_4_,(float)uStack_ae8);
        local_b60 = local_dc0;
        uStack_b58 = uStackY_db8;
        uStack_b50 = uStackY_db0;
        uStack_b48 = uStackY_da8;
        local_b40._0_4_ = local_5c0._0_4_;
        local_b40._4_4_ = local_5c0._4_4_;
        uStack_b38._0_4_ = local_5c0._8_4_;
        uStack_b38._4_4_ = local_5c0._12_4_;
        uStack_b30._0_4_ = auStack_5b0._0_4_;
        uStack_b30._4_4_ = auStack_5b0._4_4_;
        uStack_b28._0_4_ = auStack_5b0._8_4_;
        uStack_b28._4_4_ = auStack_5b0._12_4_;
        local_dc0 = CONCAT44(local_b40._4_4_ * local_b00._4_4_,(float)local_b40 * (float)local_b00);
        uStackY_db8 = CONCAT44(uStack_b38._4_4_ * uStack_af8._4_4_,
                               (float)uStack_b38 * (float)uStack_af8);
        uStackY_db0 = CONCAT44(uStack_b30._4_4_ * uStack_af0._4_4_,
                               (float)uStack_b30 * (float)uStack_af0);
        uStackY_da8 = CONCAT44(uStack_b28._4_4_,(float)uStack_b28 * (float)uStack_ae8);
        local_940 = local_dc0;
        uStack_938 = uStackY_db8;
        uStack_930 = uStackY_db0;
        uStack_928 = uStackY_da8;
        local_960._8_8_ = uStackY_db8;
        local_960._0_8_ = local_dc0;
        local_540 = local_dc0;
        uStack_538 = uStackY_db8;
        uStack_530 = uStackY_db0;
        uStack_528 = uStackY_da8;
        local_520 = 0xc1100000c1100000;
        uStack_518 = 0xc1100000c1100000;
        uStack_510 = 0xc1100000c1100000;
        uStack_508 = 0xc1100000c1100000;
        auVar7._8_8_ = 0xc1100000c1100000;
        auVar7._0_8_ = 0xc1100000c1100000;
        auVar7._16_8_ = 0xc1100000c1100000;
        auVar7._24_8_ = 0xc1100000c1100000;
        auVar3._16_8_ = uStackY_db0;
        auVar3._0_16_ = local_960._0_16_;
        auVar3._24_8_ = uStackY_da8;
        auVar3 = vmaxps_avx(auVar7,auVar3);
        local_960._0_8_ = auVar3._0_8_;
        local_500 = local_960._0_8_;
        local_960._8_8_ = auVar3._8_8_;
        uStack_4f8 = local_960._8_8_;
        local_960._16_8_ = auVar3._16_8_;
        uStack_4f0 = local_960._16_8_;
        local_960._24_8_ = auVar3._24_8_;
        uStack_4e8 = local_960._24_8_;
        local_4e0 = 0x4110000041100000;
        uStack_4d8 = 0x4110000041100000;
        uStack_4d0 = 0x4110000041100000;
        uStack_4c8 = 0x4110000041100000;
        auVar8._8_8_ = 0x4110000041100000;
        auVar8._0_8_ = 0x4110000041100000;
        auVar8._16_8_ = 0x4110000041100000;
        auVar8._24_8_ = 0x4110000041100000;
        local_960 = vminps_avx(auVar8,auVar3);
        local_8e0 = local_960._0_8_;
        uStack_8d8 = local_960._8_8_;
        uStack_8d0 = local_960._16_8_;
        uStack_8c8 = local_960._24_8_;
        local_8c0._0_4_ = local_960._0_4_;
        local_8c0._4_4_ = local_960._4_4_;
        uStack_8b8._0_4_ = local_960._8_4_;
        uStack_8b8._4_4_ = local_960._12_4_;
        uStack_8b0._0_4_ = local_960._16_4_;
        uStack_8b0._4_4_ = local_960._20_4_;
        uStack_8a8._0_4_ = local_960._24_4_;
        uStack_8a8._4_4_ = local_960._28_4_;
        uStack_964 = uStack_8a8._4_4_;
        local_980 = (float)local_8c0 * (float)local_8c0;
        fStack_97c = local_8c0._4_4_ * local_8c0._4_4_;
        fStack_978 = (float)uStack_8b8 * (float)uStack_8b8;
        fStack_974 = uStack_8b8._4_4_ * uStack_8b8._4_4_;
        fStack_970 = (float)uStack_8b0 * (float)uStack_8b0;
        fStack_96c = uStack_8b0._4_4_ * uStack_8b0._4_4_;
        fStack_968 = (float)uStack_8a8 * (float)uStack_8a8;
        local_3e8 = &local_980;
        local_3f0 = _ps256_cephes_tanh_p0;
        local_3f8 = _ps256_cephes_tanh_p1;
        local_360 = CONCAT44(fStack_97c,local_980);
        uStack_358 = CONCAT44(fStack_974,fStack_978);
        uStack_350 = CONCAT44(fStack_96c,fStack_970);
        uStack_348 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar21._4_4_ = fStack_97c;
        auVar21._0_4_ = local_980;
        auVar21._8_4_ = fStack_978;
        auVar21._12_4_ = fStack_974;
        auVar21._16_4_ = fStack_970;
        auVar21._20_4_ = fStack_96c;
        auVar21._24_4_ = fStack_968;
        auVar21._28_4_ = uStack_8a8._4_4_;
        local_380[0] = -2.7607684e-16;
        local_380[1] = -2.7607684e-16;
        afStack_378[0] = -2.7607684e-16;
        afStack_378[1] = -2.7607684e-16;
        afStack_370[0] = -2.7607684e-16;
        afStack_370[1] = -2.7607684e-16;
        afStack_368[0] = -2.7607684e-16;
        afStack_368[1] = -2.7607684e-16;
        local_3a0[0] = 2.000188e-13;
        local_3a0[1] = 2.000188e-13;
        afStack_398[0] = 2.000188e-13;
        afStack_398[1] = 2.000188e-13;
        afStack_390[0] = 2.000188e-13;
        afStack_390[1] = 2.000188e-13;
        afStack_388[0] = 2.000188e-13;
        afStack_388[1] = 2.000188e-13;
        auVar11._8_4_ = -2.7607684e-16;
        auVar11._12_4_ = -2.7607684e-16;
        auVar11._0_4_ = -2.7607684e-16;
        auVar11._4_4_ = -2.7607684e-16;
        auVar11._16_4_ = -2.7607684e-16;
        auVar11._20_4_ = -2.7607684e-16;
        auVar11._24_4_ = -2.7607684e-16;
        auVar11._28_4_ = -2.7607684e-16;
        auVar10._8_4_ = 2.000188e-13;
        auVar10._12_4_ = 2.000188e-13;
        auVar10._0_4_ = 2.000188e-13;
        auVar10._4_4_ = 2.000188e-13;
        auVar10._16_4_ = 2.000188e-13;
        auVar10._20_4_ = 2.000188e-13;
        auVar10._24_4_ = 2.000188e-13;
        auVar10._28_4_ = 2.000188e-13;
        auVar4 = vfmadd213ps_fma(auVar11,auVar21,auVar10);
        local_400 = local_9a0;
        local_408 = &local_980;
        local_410 = _ps256_cephes_tanh_p2;
        local_9a0 = auVar4._0_8_;
        local_300 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uStack_2f8 = uStack_998;
        uStack_2f0 = 0;
        uStack_2e8 = 0;
        local_320 = CONCAT44(fStack_97c,local_980);
        uStack_318 = CONCAT44(fStack_974,fStack_978);
        uStack_310 = CONCAT44(fStack_96c,fStack_970);
        uStack_308 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar22._4_4_ = fStack_97c;
        auVar22._0_4_ = local_980;
        auVar22._8_4_ = fStack_978;
        auVar22._12_4_ = fStack_974;
        auVar22._16_4_ = fStack_970;
        auVar22._20_4_ = fStack_96c;
        auVar22._24_4_ = fStack_968;
        auVar22._28_4_ = uStack_8a8._4_4_;
        local_340[0] = -8.604672e-11;
        local_340[1] = -8.604672e-11;
        afStack_338[0] = -8.604672e-11;
        afStack_338[1] = -8.604672e-11;
        afStack_330[0] = -8.604672e-11;
        afStack_330[1] = -8.604672e-11;
        afStack_328[0] = -8.604672e-11;
        afStack_328[1] = -8.604672e-11;
        auVar12._8_4_ = -8.604672e-11;
        auVar12._12_4_ = -8.604672e-11;
        auVar12._0_4_ = -8.604672e-11;
        auVar12._4_4_ = -8.604672e-11;
        auVar12._16_4_ = -8.604672e-11;
        auVar12._20_4_ = -8.604672e-11;
        auVar12._24_4_ = -8.604672e-11;
        auVar12._28_4_ = -8.604672e-11;
        auVar4 = vfmadd213ps_fma(auVar22,ZEXT1632(auVar4),auVar12);
        local_418 = local_9a0;
        local_420 = &local_980;
        local_428 = _ps256_cephes_tanh_p3;
        local_9a0 = auVar4._0_8_;
        local_2a0 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uStack_298 = uStack_998;
        uStack_290 = 0;
        uStack_288 = 0;
        local_2c0 = CONCAT44(fStack_97c,local_980);
        uStack_2b8 = CONCAT44(fStack_974,fStack_978);
        uStack_2b0 = CONCAT44(fStack_96c,fStack_970);
        uStack_2a8 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar23._4_4_ = fStack_97c;
        auVar23._0_4_ = local_980;
        auVar23._8_4_ = fStack_978;
        auVar23._12_4_ = fStack_974;
        auVar23._16_4_ = fStack_970;
        auVar23._20_4_ = fStack_96c;
        auVar23._24_4_ = fStack_968;
        auVar23._28_4_ = uStack_8a8._4_4_;
        local_2e0[0] = 5.1222973e-08;
        local_2e0[1] = 5.1222973e-08;
        afStack_2d8[0] = 5.1222973e-08;
        afStack_2d8[1] = 5.1222973e-08;
        afStack_2d0[0] = 5.1222973e-08;
        afStack_2d0[1] = 5.1222973e-08;
        afStack_2c8[0] = 5.1222973e-08;
        afStack_2c8[1] = 5.1222973e-08;
        auVar13._8_4_ = 5.1222973e-08;
        auVar13._12_4_ = 5.1222973e-08;
        auVar13._0_4_ = 5.1222973e-08;
        auVar13._4_4_ = 5.1222973e-08;
        auVar13._16_4_ = 5.1222973e-08;
        auVar13._20_4_ = 5.1222973e-08;
        auVar13._24_4_ = 5.1222973e-08;
        auVar13._28_4_ = 5.1222973e-08;
        auVar4 = vfmadd213ps_fma(auVar23,ZEXT1632(auVar4),auVar13);
        local_430 = local_9a0;
        local_438 = &local_980;
        local_440 = _ps256_cephes_tanh_p4;
        local_9a0 = auVar4._0_8_;
        local_240 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uStack_238 = uStack_998;
        uStack_230 = 0;
        uStack_228 = 0;
        local_260 = CONCAT44(fStack_97c,local_980);
        uStack_258 = CONCAT44(fStack_974,fStack_978);
        uStack_250 = CONCAT44(fStack_96c,fStack_970);
        uStack_248 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar24._4_4_ = fStack_97c;
        auVar24._0_4_ = local_980;
        auVar24._8_4_ = fStack_978;
        auVar24._12_4_ = fStack_974;
        auVar24._16_4_ = fStack_970;
        auVar24._20_4_ = fStack_96c;
        auVar24._24_4_ = fStack_968;
        auVar24._28_4_ = uStack_8a8._4_4_;
        local_280[0] = 1.48572235e-05;
        local_280[1] = 1.48572235e-05;
        afStack_278[0] = 1.48572235e-05;
        afStack_278[1] = 1.48572235e-05;
        afStack_270[0] = 1.48572235e-05;
        afStack_270[1] = 1.48572235e-05;
        afStack_268[0] = 1.48572235e-05;
        afStack_268[1] = 1.48572235e-05;
        auVar14._8_4_ = 1.48572235e-05;
        auVar14._12_4_ = 1.48572235e-05;
        auVar14._0_4_ = 1.48572235e-05;
        auVar14._4_4_ = 1.48572235e-05;
        auVar14._16_4_ = 1.48572235e-05;
        auVar14._20_4_ = 1.48572235e-05;
        auVar14._24_4_ = 1.48572235e-05;
        auVar14._28_4_ = 1.48572235e-05;
        auVar4 = vfmadd213ps_fma(auVar24,ZEXT1632(auVar4),auVar14);
        local_448 = local_9a0;
        local_450 = &local_980;
        local_458 = _ps256_cephes_tanh_p5;
        local_9a0 = auVar4._0_8_;
        local_1e0 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uStack_1d8 = uStack_998;
        uStack_1d0 = 0;
        uStack_1c8 = 0;
        local_200 = CONCAT44(fStack_97c,local_980);
        uStack_1f8 = CONCAT44(fStack_974,fStack_978);
        uStack_1f0 = CONCAT44(fStack_96c,fStack_970);
        uStack_1e8 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar25._4_4_ = fStack_97c;
        auVar25._0_4_ = local_980;
        auVar25._8_4_ = fStack_978;
        auVar25._12_4_ = fStack_974;
        auVar25._16_4_ = fStack_970;
        auVar25._20_4_ = fStack_96c;
        auVar25._24_4_ = fStack_968;
        auVar25._28_4_ = uStack_8a8._4_4_;
        local_220[0] = 0.00063726195;
        local_220[1] = 0.00063726195;
        afStack_218[0] = 0.00063726195;
        afStack_218[1] = 0.00063726195;
        afStack_210[0] = 0.00063726195;
        afStack_210[1] = 0.00063726195;
        afStack_208[0] = 0.00063726195;
        afStack_208[1] = 0.00063726195;
        auVar15._8_4_ = 0.00063726195;
        auVar15._12_4_ = 0.00063726195;
        auVar15._0_4_ = 0.00063726195;
        auVar15._4_4_ = 0.00063726195;
        auVar15._16_4_ = 0.00063726195;
        auVar15._20_4_ = 0.00063726195;
        auVar15._24_4_ = 0.00063726195;
        auVar15._28_4_ = 0.00063726195;
        auVar4 = vfmadd213ps_fma(auVar25,ZEXT1632(auVar4),auVar15);
        local_460 = local_9a0;
        local_468 = &local_980;
        local_470 = _ps256_cephes_tanh_p6;
        local_9a0 = auVar4._0_8_;
        local_180 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uStack_178 = uStack_998;
        uStack_170 = 0;
        uStack_168 = 0;
        local_1a0 = CONCAT44(fStack_97c,local_980);
        uStack_198 = CONCAT44(fStack_974,fStack_978);
        uStack_190 = CONCAT44(fStack_96c,fStack_970);
        uStack_188 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar26._4_4_ = fStack_97c;
        auVar26._0_4_ = local_980;
        auVar26._8_4_ = fStack_978;
        auVar26._12_4_ = fStack_974;
        auVar26._16_4_ = fStack_970;
        auVar26._20_4_ = fStack_96c;
        auVar26._24_4_ = fStack_968;
        auVar26._28_4_ = uStack_8a8._4_4_;
        local_1c0[0] = 0.0048935246;
        local_1c0[1] = 0.0048935246;
        afStack_1b8[0] = 0.0048935246;
        afStack_1b8[1] = 0.0048935246;
        afStack_1b0[0] = 0.0048935246;
        afStack_1b0[1] = 0.0048935246;
        afStack_1a8[0] = 0.0048935246;
        afStack_1a8[1] = 0.0048935246;
        auVar16._8_4_ = 0.0048935246;
        auVar16._12_4_ = 0.0048935246;
        auVar16._0_4_ = 0.0048935246;
        auVar16._4_4_ = 0.0048935246;
        auVar16._16_4_ = 0.0048935246;
        auVar16._20_4_ = 0.0048935246;
        auVar16._24_4_ = 0.0048935246;
        auVar16._28_4_ = 0.0048935246;
        auVar4 = vfmadd213ps_fma(auVar26,ZEXT1632(auVar4),auVar16);
        local_9a0 = auVar4._0_8_;
        uVar5 = local_9a0;
        uStack_998 = auVar4._8_8_;
        uVar6 = uStack_998;
        uStack_8f0 = 0;
        uStack_8e8 = 0;
        local_920 = local_960._0_8_;
        uStack_918 = local_960._8_8_;
        uStack_910 = local_960._16_8_;
        uStack_908 = local_960._24_8_;
        local_900._0_4_ = auVar4._0_4_;
        local_900._4_4_ = auVar4._4_4_;
        uStack_8f8._0_4_ = auVar4._8_4_;
        uStack_8f8._4_4_ = auVar4._12_4_;
        uStack_8a8._0_4_ = (float)uStack_8a8 * 0.0;
        local_9a0._4_4_ = local_900._4_4_ * local_8c0._4_4_;
        local_9a0._0_4_ = (float)local_900 * (float)local_8c0;
        uStack_998._0_4_ = (float)uStack_8f8 * (float)uStack_8b8;
        uStack_998._4_4_ = uStack_8f8._4_4_ * uStack_8b8._4_4_;
        uStack_990._0_4_ = (float)uStack_8b0 * 0.0;
        uStack_990._4_4_ = uStack_8b0._4_4_ * 0.0;
        auVar30 = _local_9a0;
        uStack_988._0_4_ = (float)uStack_8a8;
        uStack_988._4_4_ = 0;
        auVar3 = _local_9a0;
        local_478 = &local_980;
        local_480 = _ps256_cephes_tanh_p7;
        local_488 = _ps256_cephes_tanh_p8;
        local_120 = CONCAT44(fStack_97c,local_980);
        uStack_118 = CONCAT44(fStack_974,fStack_978);
        uStack_110 = CONCAT44(fStack_96c,fStack_970);
        uStack_108 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar27._4_4_ = fStack_97c;
        auVar27._0_4_ = local_980;
        auVar27._8_4_ = fStack_978;
        auVar27._12_4_ = fStack_974;
        auVar27._16_4_ = fStack_970;
        auVar27._20_4_ = fStack_96c;
        auVar27._24_4_ = fStack_968;
        auVar27._28_4_ = uStack_8a8._4_4_;
        local_140[0] = 1.1982584e-06;
        local_140[1] = 1.1982584e-06;
        afStack_138[0] = 1.1982584e-06;
        afStack_138[1] = 1.1982584e-06;
        afStack_130[0] = 1.1982584e-06;
        afStack_130[1] = 1.1982584e-06;
        afStack_128[0] = 1.1982584e-06;
        afStack_128[1] = 1.1982584e-06;
        local_160[0] = 0.00011853471;
        local_160[1] = 0.00011853471;
        afStack_158[0] = 0.00011853471;
        afStack_158[1] = 0.00011853471;
        afStack_150[0] = 0.00011853471;
        afStack_150[1] = 0.00011853471;
        afStack_148[0] = 0.00011853471;
        afStack_148[1] = 0.00011853471;
        auVar18._8_4_ = 1.1982584e-06;
        auVar18._12_4_ = 1.1982584e-06;
        auVar18._0_4_ = 1.1982584e-06;
        auVar18._4_4_ = 1.1982584e-06;
        auVar18._16_4_ = 1.1982584e-06;
        auVar18._20_4_ = 1.1982584e-06;
        auVar18._24_4_ = 1.1982584e-06;
        auVar18._28_4_ = 1.1982584e-06;
        auVar17._8_4_ = 0.00011853471;
        auVar17._12_4_ = 0.00011853471;
        auVar17._0_4_ = 0.00011853471;
        auVar17._4_4_ = 0.00011853471;
        auVar17._16_4_ = 0.00011853471;
        auVar17._20_4_ = 0.00011853471;
        auVar17._24_4_ = 0.00011853471;
        auVar17._28_4_ = 0.00011853471;
        auVar4 = vfmadd213ps_fma(auVar18,auVar27,auVar17);
        local_490 = local_9c0;
        local_498 = &local_980;
        local_4a0 = _ps256_cephes_tanh_p9;
        local_9c0._0_8_ = auVar4._0_8_;
        local_c0 = local_9c0._0_8_;
        local_9c0._8_8_ = auVar4._8_8_;
        uStack_b8 = local_9c0._8_8_;
        uStack_b0 = 0;
        uStack_a8 = 0;
        local_e0 = CONCAT44(fStack_97c,local_980);
        uStack_d8 = CONCAT44(fStack_974,fStack_978);
        uStack_d0 = CONCAT44(fStack_96c,fStack_970);
        uStack_c8 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar28._4_4_ = fStack_97c;
        auVar28._0_4_ = local_980;
        auVar28._8_4_ = fStack_978;
        auVar28._12_4_ = fStack_974;
        auVar28._16_4_ = fStack_970;
        auVar28._20_4_ = fStack_96c;
        auVar28._24_4_ = fStack_968;
        auVar28._28_4_ = uStack_8a8._4_4_;
        local_100[0] = 0.0022684347;
        local_100[1] = 0.0022684347;
        afStack_f8[0] = 0.0022684347;
        afStack_f8[1] = 0.0022684347;
        afStack_f0[0] = 0.0022684347;
        afStack_f0[1] = 0.0022684347;
        afStack_e8[0] = 0.0022684347;
        afStack_e8[1] = 0.0022684347;
        auVar19._8_4_ = 0.0022684347;
        auVar19._12_4_ = 0.0022684347;
        auVar19._0_4_ = 0.0022684347;
        auVar19._4_4_ = 0.0022684347;
        auVar19._16_4_ = 0.0022684347;
        auVar19._20_4_ = 0.0022684347;
        auVar19._24_4_ = 0.0022684347;
        auVar19._28_4_ = 0.0022684347;
        auVar4 = vfmadd213ps_fma(auVar28,ZEXT1632(auVar4),auVar19);
        local_4a8 = local_9c0;
        local_4b0 = &local_980;
        local_4b8 = _ps256_cephes_tanh_p6;
        local_9c0._0_8_ = auVar4._0_8_;
        local_60 = local_9c0._0_8_;
        local_9c0._8_8_ = auVar4._8_8_;
        uStack_58 = local_9c0._8_8_;
        uStack_50 = 0;
        uStack_48 = 0;
        local_80 = CONCAT44(fStack_97c,local_980);
        uStack_78 = CONCAT44(fStack_974,fStack_978);
        uStack_70 = CONCAT44(fStack_96c,fStack_970);
        uStack_68 = CONCAT44(uStack_8a8._4_4_,fStack_968);
        auVar29._4_4_ = fStack_97c;
        auVar29._0_4_ = local_980;
        auVar29._8_4_ = fStack_978;
        auVar29._12_4_ = fStack_974;
        auVar29._16_4_ = fStack_970;
        auVar29._20_4_ = fStack_96c;
        auVar29._24_4_ = fStack_968;
        auVar29._28_4_ = uStack_8a8._4_4_;
        local_a0[0] = 0.0048935246;
        local_a0[1] = 0.0048935246;
        afStack_98[0] = 0.0048935246;
        afStack_98[1] = 0.0048935246;
        afStack_90[0] = 0.0048935246;
        afStack_90[1] = 0.0048935246;
        afStack_88[0] = 0.0048935246;
        afStack_88[1] = 0.0048935246;
        auVar20._8_4_ = 0.0048935246;
        auVar20._12_4_ = 0.0048935246;
        auVar20._0_4_ = 0.0048935246;
        auVar20._4_4_ = 0.0048935246;
        auVar20._16_4_ = 0.0048935246;
        auVar20._20_4_ = 0.0048935246;
        auVar20._24_4_ = 0.0048935246;
        auVar20._28_4_ = 0.0048935246;
        auVar4 = vfmadd213ps_fma(auVar29,ZEXT1632(auVar4),auVar20);
        local_3c0 = local_9a0;
        uStack_3b8 = uStack_998;
        uStack_990 = auVar30._16_8_;
        uStack_3b0 = uStack_990;
        uStack_988 = (ulong)(uint)(float)uStack_8a8;
        uStack_3a8 = uStack_988;
        local_9c0._0_8_ = auVar4._0_8_;
        local_3e0 = local_9c0._0_8_;
        local_9c0._8_8_ = auVar4._8_8_;
        uStack_3d8 = local_9c0._8_8_;
        uStack_3d0 = 0;
        uStack_3c8 = 0;
        auVar9._16_8_ = uStack_990;
        auVar9._0_16_ = _local_9a0;
        auVar9._24_4_ = (float)uStack_8a8;
        auVar9._28_4_ = 0;
        local_9e0 = vdivps_avx(auVar9,ZEXT1632(auVar4));
        local_a40._0_4_ = local_600._0_4_;
        local_a40._4_4_ = local_600._4_4_;
        uStack_a38._0_4_ = local_600._8_4_;
        uStack_a38._4_4_ = local_600._12_4_;
        uStack_a30._0_4_ = auStack_5f0._0_4_;
        uStack_a30._4_4_ = auStack_5f0._4_4_;
        uStack_a28._0_4_ = auStack_5f0._8_4_;
        uStack_a28._4_4_ = auStack_5f0._12_4_;
        local_a60._0_4_ = local_9e0._0_4_;
        local_a60._4_4_ = local_9e0._4_4_;
        uStack_a58._0_4_ = local_9e0._8_4_;
        uStack_a58._4_4_ = local_9e0._12_4_;
        uStack_a50._0_4_ = local_9e0._16_4_;
        uStack_a50._4_4_ = local_9e0._20_4_;
        uStack_a48._0_4_ = local_9e0._24_4_;
        uStack_a48._4_4_ = local_9e0._28_4_;
        fStack_bc4 = uStack_a28._4_4_ + uStack_a48._4_4_;
        local_dc0 = CONCAT44(local_a40._4_4_ + local_a60._4_4_,(float)local_a40 + (float)local_a60);
        uStackY_db8 = CONCAT44(uStack_a38._4_4_ + uStack_a58._4_4_,
                               (float)uStack_a38 + (float)uStack_a58);
        uStackY_db0 = CONCAT44(uStack_a30._4_4_ + uStack_a50._4_4_,
                               (float)uStack_a30 + (float)uStack_a50);
        uStackY_da8 = CONCAT44(fStack_bc4,(float)uStack_a28 + (float)uStack_a48);
        local_b80 = local_dc0;
        uStack_b78 = uStackY_db8;
        uStack_b70 = uStackY_db0;
        uStack_b68 = uStackY_da8;
        local_be0 = ((float)local_a40 + (float)local_a60) * (float)local_a80;
        fStack_bdc = (local_a40._4_4_ + local_a60._4_4_) * local_a80._4_4_;
        fStack_bd8 = ((float)uStack_a38 + (float)uStack_a58) * (float)uStack_a78;
        fStack_bd4 = (uStack_a38._4_4_ + uStack_a58._4_4_) * uStack_a78._4_4_;
        fStack_bd0 = ((float)uStack_a30 + (float)uStack_a50) * (float)uStack_a70;
        fStack_bcc = (uStack_a30._4_4_ + uStack_a50._4_4_) * uStack_a70._4_4_;
        fStack_bc8 = ((float)uStack_a28 + (float)uStack_a48) * (float)uStack_a68;
        local_bc0._0_4_ = local_640._0_4_;
        local_bc0._4_4_ = local_640._4_4_;
        uStack_bb8._0_4_ = local_640._8_4_;
        uStack_bb8._4_4_ = local_640._12_4_;
        uStack_bb0._0_4_ = auStack_630._0_4_;
        uStack_bb0._4_4_ = auStack_630._4_4_;
        uStack_ba8._0_4_ = auStack_630._8_4_;
        uStack_ba8._4_4_ = auStack_630._12_4_;
        local_dc0 = CONCAT44(local_bc0._4_4_ * fStack_bdc,(float)local_bc0 * local_be0);
        uStackY_db8 = CONCAT44(uStack_bb8._4_4_ * fStack_bd4,(float)uStack_bb8 * fStack_bd8);
        uStackY_db0 = CONCAT44(uStack_bb0._4_4_ * fStack_bcc,(float)uStack_bb0 * fStack_bd0);
        uStackY_da8 = CONCAT44(uStack_ba8._4_4_,(float)uStack_ba8 * fStack_bc8);
        local_878 = local_c78;
        local_8a0 = local_dc0;
        uStack_898 = uStackY_db8;
        uStack_890 = uStackY_db0;
        uStack_888 = uStackY_da8;
        *(undefined8 *)local_c78 = local_dc0;
        *(undefined8 *)(local_c78 + 2) = uStackY_db8;
        *(undefined8 *)(local_c78 + 4) = uStackY_db0;
        *(undefined8 *)(local_c78 + 6) = uStackY_da8;
        local_c78 = local_c78 + 8;
        local_bc0 = local_640._0_8_;
        uStack_bb8 = local_640._8_8_;
        uStack_bb0 = auStack_630._0_8_;
        uStack_ba8 = auStack_630._8_8_;
        local_b40 = local_5c0._0_8_;
        uStack_b38 = local_5c0._8_8_;
        uStack_b30 = auStack_5b0._0_8_;
        uStack_b28 = auStack_5b0._8_8_;
        local_b00 = local_580._0_8_;
        uStack_af8 = local_580._8_8_;
        uStack_af0 = local_580._16_8_;
        uStack_ae8 = local_580._24_8_;
        local_ac0 = local_ba0;
        uStack_ab8 = uStack_b98;
        uStack_ab0 = uStack_b90;
        uStack_aa8 = uStack_b88;
        local_aa0 = local_ba0;
        uStack_a98 = uStack_b98;
        uStack_a90 = uStack_b90;
        uStack_a88 = uStack_b88;
        local_a80 = local_ba0;
        uStack_a78 = uStack_b98;
        uStack_a70 = uStack_b90;
        uStack_a68 = uStack_b88;
        local_a60 = local_9e0._0_8_;
        uStack_a58 = local_9e0._8_8_;
        uStack_a50 = local_9e0._16_8_;
        uStack_a48 = local_9e0._24_8_;
        local_a40 = local_600._0_8_;
        uStack_a38 = local_600._8_8_;
        uStack_a30 = auStack_5f0._0_8_;
        uStack_a28 = auStack_5f0._8_8_;
        local_a00 = local_ba0;
        uStack_9f8 = uStack_b98;
        uStack_9f0 = uStack_b90;
        uStack_9e8 = uStack_b88;
        local_9c0 = ZEXT1632(auVar4);
        _local_9a0 = auVar3;
        local_900 = uVar5;
        uStack_8f8 = uVar6;
        local_8c0 = local_960._0_8_;
        uStack_8b8 = local_960._8_8_;
        uStack_8b0 = local_960._16_8_;
        uStack_8a8 = local_960._24_8_;
      }
      local_7fc = 0x3f000000;
      local_810 = 0x3f000000;
      uStack_80c = 0x3f000000;
      uStack_808 = 0x3f000000;
      uStack_804 = 0x3f000000;
      local_814 = 0x3f800000;
      local_830 = 0x3f800000;
      uStack_82c = 0x3f800000;
      uStack_828 = 0x3f800000;
      uStack_824 = 0x3f800000;
      local_834 = 0x3f4c4229;
      local_850 = 0x3f4c4229;
      uStack_84c = 0x3f4c4229;
      uStack_848 = 0x3f4c4229;
      uStack_844 = 0x3f4c4229;
      local_854 = 0x3d372713;
      local_870 = 0x3d372713;
      uStack_86c = 0x3d372713;
      uStack_868 = 0x3d372713;
      uStack_864 = 0x3d372713;
      local_670 = local_c08;
      local_580 = auVar32;
      local_ca0 = local_6d0;
      for (; local_cd0 + 3 < local_c68; local_cd0 = local_cd0 + 4) {
        local_7f8 = local_c78;
        uVar5 = *(undefined8 *)local_c78;
        uVar6 = *(undefined8 *)(local_c78 + 2);
        local_740._0_4_ = (float)uVar5;
        fVar31 = (float)local_740;
        local_740._4_4_ = (float)((ulong)uVar5 >> 0x20);
        fVar33 = local_740._4_4_;
        uStack_738._0_4_ = (float)uVar6;
        fVar34 = (float)uStack_738;
        uStack_738._4_4_ = (float)((ulong)uVar6 >> 0x20);
        fVar36 = uStack_738._4_4_;
        local_770 = CONCAT44(local_740._4_4_ * local_740._4_4_,(float)local_740 * (float)local_740);
        uStack_768 = CONCAT44(uStack_738._4_4_ * uStack_738._4_4_,
                              (float)uStack_738 * (float)uStack_738);
        fVar38 = (float)local_740 * (float)local_740 * (float)local_740;
        fVar39 = local_740._4_4_ * local_740._4_4_ * local_740._4_4_;
        fVar40 = (float)uStack_738 * (float)uStack_738 * (float)uStack_738;
        fVar37 = uStack_738._4_4_ * uStack_738._4_4_ * uStack_738._4_4_;
        local_790 = CONCAT44(fVar39,fVar38);
        uStack_788 = CONCAT44(fVar37,fVar40);
        fVar38 = fVar38 * 0.044715;
        fVar39 = fVar39 * 0.044715;
        fVar40 = fVar40 * 0.044715;
        fVar37 = fVar37 * 0.044715;
        local_e30 = CONCAT44(fVar39,fVar38);
        uStackY_e28 = CONCAT44(fVar37,fVar40);
        local_710 = local_e30;
        uStack_708 = uStackY_e28;
        local_740._0_4_ = (float)local_740 + fVar38;
        local_740._4_4_ = local_740._4_4_ + fVar39;
        uStack_738._0_4_ = (float)uStack_738 + fVar40;
        uStack_738._4_4_ = uStack_738._4_4_ + fVar37;
        local_e30 = CONCAT44(local_740._4_4_,(float)local_740);
        uStackY_e28 = CONCAT44(uStack_738._4_4_,(float)uStack_738);
        local_7b0 = local_e30;
        uStack_7a8 = uStackY_e28;
        uStackY_e28 = CONCAT44(uStack_738._4_4_ * 0.7978845,(float)uStack_738 * 0.7978845);
        afVar41[2] = 0.7978845;
        afVar41[3] = 0.7978845;
        afVar41[0] = (float)local_740 * 0.7978845;
        afVar41[1] = local_740._4_4_ * 0.7978845;
        uVar35 = uStackY_e28;
        local_7a0 = 0x3f4c42293f4c4229;
        uStack_798 = 0x3f4c42293f4c4229;
        local_780 = 0x3d3727133d372713;
        uStack_778 = 0x3d3727133d372713;
        local_760 = uVar5;
        uStack_758 = uVar6;
        local_750 = uVar5;
        uStack_748 = uVar6;
        local_740 = uVar5;
        uStack_738 = uVar6;
        local_700 = uVar5;
        uStack_6f8 = uVar6;
        afVar41 = tanh_ps(afVar41);
        local_730._0_4_ = afVar41[0];
        local_730._4_4_ = afVar41[1];
        uStack_728._0_4_ = (float)uVar35;
        uStack_728._4_4_ = (float)((ulong)uVar35 >> 0x20);
        local_e30 = CONCAT44(local_730._4_4_ + 1.0,(float)local_730 + 1.0);
        uStackY_e28 = CONCAT44(uStack_728._4_4_ + 1.0,(float)uStack_728 + 1.0);
        local_7c0 = local_e30;
        uStack_7b8 = uStackY_e28;
        local_7f0 = ((float)local_730 + 1.0) * fVar31;
        fStack_7ec = (local_730._4_4_ + 1.0) * fVar33;
        fStack_7e8 = ((float)uStack_728 + 1.0) * fVar34;
        fStack_7e4 = (uStack_728._4_4_ + 1.0) * fVar36;
        local_e30 = CONCAT44(fStack_7ec * 0.5,local_7f0 * 0.5);
        uStackY_e28 = CONCAT44(fStack_7e4 * 0.5,fStack_7e8 * 0.5);
        local_6d8 = local_c78;
        local_6f0 = local_e30;
        uStack_6e8 = uStackY_e28;
        *(undefined8 *)local_c78 = local_e30;
        *(undefined8 *)(local_c78 + 2) = uStackY_e28;
        local_c78 = local_c78 + 4;
        local_7e0 = 0x3f0000003f000000;
        uStack_7d8 = 0x3f0000003f000000;
        local_7d0 = uVar5;
        uStack_7c8 = uVar6;
        local_730 = afVar41._0_8_;
        uStack_728 = uVar35;
        local_720 = 0x3f8000003f800000;
        uStack_718 = 0x3f8000003f800000;
      }
      for (; local_cd0 < local_c68; local_cd0 = local_cd0 + 1) {
        fVar31 = *local_c78;
        fVar33 = tanhf((*local_c78 + *local_c78 * 0.044715 * *local_c78 * *local_c78) * 0.7978845);
        *local_c78 = fVar31 * 0.5 * (fVar33 + 1.0);
        local_c78 = local_c78 + 1;
      }
    }
    local_c34 = 0;
  }
  return local_c34;
}

Assistant:

int GELU_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    if (!fast_gelu)
    {
        return GELU::forward_inplace(bottom_top_blob, opt);
    }

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int elempack = bottom_top_blob.elempack;
    int channels = bottom_top_blob.c;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _half512 = _mm512_set1_ps(0.5f);
        __m512 _one512 = _mm512_set1_ps(1.f);
        __m512 _fast1c512 = _mm512_set1_ps(0.79788452f);
        __m512 _fast2c512 = _mm512_set1_ps(0.044715f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _pLoad = _mm512_loadu_ps(ptr);

            __m512 _cube = _mm512_mul_ps(_pLoad, _pLoad);
            _cube = _mm512_mul_ps(_pLoad, _cube);

            __m512 _blob = _mm512_mul_ps(_fast2c512, _cube);
            _blob = _mm512_add_ps(_pLoad, _blob);
            _blob = _mm512_mul_ps(_fast1c512, _blob);
            _blob = tanh512_ps(_blob);
            _blob = _mm512_add_ps(_one512, _blob);

            _blob = _mm512_mul_ps(_half512, _mm512_mul_ps(_blob, _pLoad));

            _mm512_storeu_ps(ptr, _blob);

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _half256 = _mm256_set1_ps(0.5f);
        __m256 _one256 = _mm256_set1_ps(1.f);
        __m256 _fast1c256 = _mm256_set1_ps(0.79788452f);
        __m256 _fast2c256 = _mm256_set1_ps(0.044715f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _pLoad = _mm256_loadu_ps(ptr);

            __m256 _cube = _mm256_mul_ps(_pLoad, _pLoad);
            _cube = _mm256_mul_ps(_pLoad, _cube);

            __m256 _blob = _mm256_mul_ps(_fast2c256, _cube);
            _blob = _mm256_add_ps(_pLoad, _blob);
            _blob = _mm256_mul_ps(_fast1c256, _blob);
            _blob = tanh256_ps(_blob);
            _blob = _mm256_add_ps(_one256, _blob);

            _blob = _mm256_mul_ps(_half256, _mm256_mul_ps(_blob, _pLoad));

            _mm256_storeu_ps(ptr, _blob);

            ptr += 8;
        }
#endif // __AVX__
        __m128 _half128 = _mm_set1_ps(0.5f);
        __m128 _one128 = _mm_set1_ps(1.f);
        __m128 _fast1c128 = _mm_set1_ps(0.79788452f);
        __m128 _fast2c128 = _mm_set1_ps(0.044715f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _pLoad = _mm_loadu_ps(ptr);

            __m128 _cube = _mm_mul_ps(_pLoad, _pLoad);
            _cube = _mm_mul_ps(_pLoad, _cube);

            __m128 _blob = _mm_mul_ps(_fast2c128, _cube);
            _blob = _mm_add_ps(_pLoad, _blob);
            _blob = _mm_mul_ps(_fast1c128, _blob);
            _blob = tanh_ps(_blob);
            _blob = _mm_add_ps(_one128, _blob);

            _blob = _mm_mul_ps(_half128, _mm_mul_ps(_blob, _pLoad));

            _mm_storeu_ps(ptr, _blob);

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            // y = 0.5x * (1 + tanh(sqrt(2/Pi) * (x + 0.044715x^3)))
            *ptr = 0.5f * *ptr * (1.0f + tanhf(0.79788452f * (*ptr + 0.044715f * *ptr * *ptr * *ptr)));

            ptr++;
        }
    }

    return 0;
}